

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O3

int Abc_NodeMffcSizeStop(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  
  if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                  ,0x4d,"int Abc_NodeMffcSizeStop(Abc_Obj_t *)");
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                  ,0x4e,"int Abc_NodeMffcSizeStop(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                  ,0x4f,"int Abc_NodeMffcSizeStop(Abc_Obj_t *)");
  }
  if ((pNode->vFanins).nSize == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = Abc_NodeRefDerefStop(pNode,0);
    iVar2 = Abc_NodeRefDerefStop(pNode,1);
    if (iVar1 != iVar2) {
      __assert_fail("nConeSize1 == nConeSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                    ,0x54,"int Abc_NodeMffcSizeStop(Abc_Obj_t *)");
    }
    if (iVar1 < 1) {
      __assert_fail("nConeSize1 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                    ,0x55,"int Abc_NodeMffcSizeStop(Abc_Obj_t *)");
    }
  }
  return iVar1;
}

Assistant:

int Abc_NodeMffcSizeStop( Abc_Obj_t * pNode )
{
    int nConeSize1, nConeSize2;
    assert( Abc_NtkIsStrash(pNode->pNtk) );
    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_ObjIsNode( pNode ) );
    if ( Abc_ObjFaninNum(pNode) == 0 )
        return 0;
    nConeSize1 = Abc_NodeRefDerefStop( pNode, 0 ); // dereference
    nConeSize2 = Abc_NodeRefDerefStop( pNode, 1 ); // reference
    assert( nConeSize1 == nConeSize2 );
    assert( nConeSize1 > 0 );
    return nConeSize1;
}